

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::scrollChildren(QWidgetPrivate *this,int dx,int dy)

{
  long lVar1;
  ulong uVar2;
  QWidget *this_00;
  QWidgetData *pQVar3;
  QPoint QVar4;
  QSize QVar5;
  QPoint QVar6;
  QWidgetPrivate *this_01;
  ulong uVar7;
  Representation RVar8;
  long in_FS_OFFSET;
  QPoint oldp;
  QPoint local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QPoint local_58;
  QArrayDataPointer<QObject_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(*(long *)&this->field_0x8 + 8);
  uVar2 = *(ulong *)(lVar1 + 0x28);
  if (uVar2 != 0) {
    local_50.d = *(Data **)(lVar1 + 0x18);
    local_50.ptr = *(QObject ***)(lVar1 + 0x20);
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.size = uVar2;
    for (uVar7 = 0; uVar7 < uVar2; uVar7 = uVar7 + 1) {
      this_00 = (QWidget *)local_50.ptr[uVar7];
      if (((this_00 != (QWidget *)0x0) &&
          ((*(byte *)(*(long *)&this_00->field_0x8 + 0x30) & 1) != 0)) &&
         (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
        local_58 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = QWidget::pos(this_00);
        QVar4 = QWidget::pos(this_00);
        QVar6.xp.m_i = QVar4.xp.m_i.m_i + dx;
        RVar8.m_i = QVar4.yp.m_i.m_i + dy;
        QVar5 = QWidget::size(this_00);
        pQVar3 = this_00->data;
        QVar6.yp.m_i = RVar8.m_i;
        (pQVar3->crect).x1 = (Representation)QVar6.xp.m_i;
        (pQVar3->crect).y1 = (Representation)RVar8.m_i;
        (pQVar3->crect).x2.m_i = QVar5.wd.m_i.m_i + QVar6.xp.m_i + -1;
        (pQVar3->crect).y2.m_i = QVar5.ht.m_i.m_i + RVar8.m_i + -1;
        this_01 = *(QWidgetPrivate **)&this_00->field_0x8;
        if ((this_01->high_attributes[0] & 0x10000000) != 0) {
          setWSGeometry(this_01);
          this_01 = *(QWidgetPrivate **)&this_00->field_0x8;
        }
        setDirtyOpaqueRegion(this_01);
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = QVar6;
        QMoveEvent::QMoveEvent((QMoveEvent *)&local_78,&local_80,&local_58);
        QCoreApplication::sendEvent((QObject *)this_00,(QEvent *)&local_78);
        QMoveEvent::~QMoveEvent((QMoveEvent *)&local_78);
      }
    }
    QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::scrollChildren(int dx, int dy)
{
    Q_Q(QWidget);
    if (q->children().size() > 0) {        // scroll children
        QPoint pd(dx, dy);
        QObjectList childObjects = q->children();
        for (int i = 0; i < childObjects.size(); ++i) { // move all children
            QWidget *w = qobject_cast<QWidget*>(childObjects.at(i));
            if (w && !w->isWindow()) {
                QPoint oldp = w->pos();
                QRect  r(w->pos() + pd, w->size());
                w->data->crect = r;
                if (w->testAttribute(Qt::WA_WState_Created))
                    w->d_func()->setWSGeometry();
                w->d_func()->setDirtyOpaqueRegion();
                QMoveEvent e(r.topLeft(), oldp);
                QCoreApplication::sendEvent(w, &e);
            }
        }
    }
}